

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

void calc_sad4_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int cand_start,int *cost_list)

{
  int iVar1;
  uint uVar2;
  buf_2d *pbVar3;
  buf_2d *pbVar4;
  search_site_config *psVar5;
  uint8_t *puVar6;
  ushort uVar7;
  FULLPEL_MV FVar8;
  long lVar9;
  long lVar10;
  short sVar11;
  short sVar12;
  ushort uVar13;
  long lVar14;
  uint *puVar15;
  short sVar16;
  ushort uVar17;
  uint uVar18;
  uchar *block_offset [4];
  short local_84;
  uint local_68 [4];
  uint8_t *local_58 [5];
  
  lVar9 = (long)search_step;
  pbVar3 = (ms_params->ms_buffers).ref;
  pbVar4 = (ms_params->ms_buffers).src;
  psVar5 = ms_params->search_sites;
  lVar10 = (long)cand_start;
  puVar6 = pbVar4->buf;
  iVar1 = pbVar4->stride;
  lVar14 = 0;
  do {
    local_58[lVar14] = center_address + psVar5->site[lVar9][lVar10 + lVar14].offset;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  puVar15 = (uint *)(cost_list + 1);
  if (cost_list == (int *)0x0) {
    puVar15 = local_68;
  }
  (*ms_params->sdx4df)(puVar6,iVar1,local_58,pbVar3->stride,puVar15);
  lVar14 = 0;
  do {
    uVar2 = puVar15[lVar14];
    if (uVar2 < *bestsad) {
      sVar11 = psVar5->site[lVar9][lVar10 + lVar14].mv.row + center_mv.row;
      local_84 = center_mv.col;
      local_84 = psVar5->site[lVar9][lVar10 + lVar14].mv.col + local_84;
      if (mv_cost_params->mv_cost_type < 4) {
        sVar16 = sVar11 - (mv_cost_params->full_ref_mv).row;
        sVar12 = local_84 - (mv_cost_params->full_ref_mv).col;
        uVar17 = sVar16 * 8;
        uVar13 = sVar12 * 8;
        switch(mv_cost_params->mv_cost_type) {
        case '\0':
          uVar18 = (mv_cost_params->mvcost[0][(short)uVar17] +
                    *(int *)((long)mv_cost_params->mvjcost +
                            (ulong)((uint)(uVar13 != 0) * 4 + (uint)(uVar17 != 0) * 8)) +
                   mv_cost_params->mvcost[1][(short)uVar13]) * mv_cost_params->sad_per_bit + 0x100U
                   >> 9;
          break;
        case '\x01':
          uVar7 = sVar16 * -8;
          if ((short)(sVar16 * -8) < 0) {
            uVar7 = uVar17;
          }
          uVar17 = sVar12 * -8;
          if ((short)(sVar12 * -8) < 0) {
            uVar17 = uVar13;
          }
          uVar18 = ((uint)uVar17 + (uint)uVar7) * 4;
          break;
        case '\x02':
          uVar7 = sVar16 * -8;
          if ((short)(sVar16 * -8) < 0) {
            uVar7 = uVar17;
          }
          uVar17 = sVar12 * -8;
          if ((short)(sVar12 * -8) < 0) {
            uVar17 = uVar13;
          }
          uVar18 = ((uint)uVar17 + (uint)uVar7) * 0xf >> 3;
          break;
        case '\x03':
          uVar7 = sVar16 * -8;
          if ((short)(sVar16 * -8) < 0) {
            uVar7 = uVar17;
          }
          uVar17 = sVar12 * -8;
          if ((short)(sVar12 * -8) < 0) {
            uVar17 = uVar13;
          }
          uVar18 = (uint)uVar17 + (uint)uVar7;
        }
      }
      else {
        uVar18 = 0;
      }
      if (uVar18 + uVar2 < *bestsad) {
        if (raw_bestsad != (uint *)0x0) {
          *raw_bestsad = uVar2;
        }
        *bestsad = uVar18 + uVar2;
        FVar8.col = local_84;
        FVar8.row = sVar11;
        *best_mv = FVar8;
        *best_site = cand_start + (int)lVar14;
      }
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  return;
}

Assistant:

static inline void calc_sad4_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, int cand_start, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];

  unsigned char const *block_offset[4];
  unsigned int sads_buf[4];
  unsigned int *sads;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  if (cost_list) {
    sads = (unsigned int *)(cost_list + 1);
  } else {
    sads = sads_buf;
  }
  // Loop over number of candidates.
  for (int j = 0; j < 4; j++)
    block_offset[j] = site[cand_start + j].offset + center_address;

  // 4-point sad calculation.
  ms_params->sdx4df(src_buf, src_stride, block_offset, ref->stride, sads);

  for (int j = 0; j < 4; j++) {
    const FULLPEL_MV this_mv = { center_mv.row + site[cand_start + j].mv.row,
                                 center_mv.col + site[cand_start + j].mv.col };
    const int found_better_mv = update_mvs_and_sad(
        sads[j], &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = cand_start + j;
  }
}